

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributesToOriginalFormat(KdTreeAttributesDecoder *this)

{
  byte bVar1;
  DataType DVar2;
  PointAttribute *att;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  long lVar3;
  pointer pAVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  vector<int,_std::allocator<int>_> signed_val;
  int local_a8;
  allocator_type local_a1;
  PointAttribute *local_a0;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_98;
  long local_90;
  int local_84;
  string local_80;
  pointer local_60;
  Type local_58;
  undefined4 uStack_54;
  long local_48;
  KdTreeAttributesDecoder *local_40;
  ulong local_38;
  
  if (((this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[6])(this);
    if (iVar6 < 1) {
      return true;
    }
    uVar11 = 0;
    local_a8 = 0;
    local_40 = this;
    local_84 = 0;
    do {
      iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[5])(this);
      iVar7 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[7])(this);
      att = *(PointAttribute **)
             (*(long *)(*(long *)(CONCAT44(extraout_var,iVar7) + 8) + 0x10) + (long)iVar6 * 8);
      local_a0 = att;
      switch((att->super_GeometryAttribute).data_type_) {
      case DT_INT8:
      case DT_INT16:
      case DT_INT32:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,
                   (ulong)(att->super_GeometryAttribute).num_components_,(allocator_type *)&local_58
                  );
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_58,
                   (ulong)(att->super_GeometryAttribute).num_components_,&local_a1);
        DVar2 = (att->super_GeometryAttribute).data_type_;
        if (DVar2 == DT_INT8) {
          bVar5 = TransformAttributeBackToSignedType<signed_char>(this,att,local_a8);
LAB_0013ff04:
          if (bVar5 != false) goto LAB_0013ff08;
          bVar5 = false;
        }
        else {
          if (DVar2 == DT_INT16) {
            bVar5 = TransformAttributeBackToSignedType<short>(this,att,local_a8);
            goto LAB_0013ff04;
          }
          if (DVar2 == DT_INT32) {
            bVar5 = TransformAttributeBackToSignedType<int>(this,att,local_a8);
            goto LAB_0013ff04;
          }
LAB_0013ff08:
          local_a8 = local_a8 + (uint)(att->super_GeometryAttribute).num_components_;
          bVar5 = true;
        }
        pvVar8 = (void *)CONCAT44(uStack_54,local_58);
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8,local_48 - (long)pvVar8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_80._M_dataplus._M_p,
                          local_80.field_2._M_allocated_capacity - (long)local_80._M_dataplus._M_p);
        }
        if (!bVar5) {
          return false;
        }
        break;
      case DT_FLOAT32:
        iVar7 = (int)uVar11;
        local_98._M_head_impl =
             *(PointAttribute **)
              &(this->quantized_portable_attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
        local_60 = (this->attribute_quantization_transforms_).
                   super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar7;
        iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[7])(this);
        this_00 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                   (CONCAT44(extraout_var_00,iVar6) + 0x50);
        local_58 = (local_a0->super_GeometryAttribute).attribute_type_;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"skip_attribute_transform","");
        bVar5 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                          (this_00,&local_58,&local_80,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        pAVar4 = local_60;
        if (bVar5) {
          PointAttribute::CopyFrom(local_a0,local_98._M_head_impl);
          uVar11 = (ulong)(iVar7 + 1);
        }
        else {
          local_90 = CONCAT44(local_90._4_4_,local_60->quantization_bits_);
          bVar1 = (local_a0->super_GeometryAttribute).num_components_;
          uVar11 = (ulong)((uint)bVar1 * 4);
          local_38 = (ulong)(iVar7 + 1);
          pvVar8 = operator_new__(uVar11);
          Dequantizer::Dequantizer((Dequantizer *)&local_80);
          bVar5 = Dequantizer::Init((Dequantizer *)&local_80,pAVar4->range_,
                                    ~(-1 << ((byte)local_90 & 0x1f)));
          if (!bVar5) {
            operator_delete__(pvVar8);
            return false;
          }
          if ((local_98._M_head_impl)->num_unique_entries_ != 0) {
            local_90 = ((local_98._M_head_impl)->super_GeometryAttribute).byte_offset_ +
                       (long)((((local_98._M_head_impl)->super_GeometryAttribute).buffer_)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
            lVar10 = 0;
            uVar12 = 0;
            iVar6 = 0;
            do {
              if ((ulong)bVar1 != 0) {
                lVar3 = *(long *)&(local_60->min_values_).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data;
                uVar9 = 0;
                do {
                  *(float *)((long)pvVar8 + uVar9 * 4) =
                       (float)*(int *)(local_90 + (long)iVar6 * 4 + uVar9 * 4) *
                       local_80._M_dataplus._M_p._0_4_ + *(float *)(lVar3 + uVar9 * 4);
                  uVar9 = uVar9 + 1;
                } while (bVar1 != uVar9);
                iVar6 = iVar6 + (int)uVar9;
              }
              memcpy((void *)(*(long *)&(((local_a0->attribute_buffer_)._M_t.
                                          super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                          .super__Head_base<0UL,_draco::DataBuffer_*,_false>.
                                         _M_head_impl)->data_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             + lVar10),pvVar8,uVar11);
              lVar10 = lVar10 + uVar11;
              uVar12 = uVar12 + 1;
            } while (uVar12 < (local_98._M_head_impl)->num_unique_entries_);
          }
          operator_delete__(pvVar8);
          uVar11 = local_38;
          this = local_40;
        }
      }
      iVar7 = local_84 + 1;
      iVar6 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this);
      local_84 = iVar7;
    } while (iVar7 < iVar6);
  }
  return true;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributesToOriginalFormat() {
  if (quantized_portable_attributes_.empty() && min_signed_values_.empty()) {
    return true;
  }
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Dequantize attributes that needed it.
  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
        att->data_type() == DT_INT8) {
      std::vector<uint32_t> unsigned_val(att->num_components());
      std::vector<int32_t> signed_val(att->num_components());
      // Values are stored as unsigned in the attribute, make them signed again.
      if (att->data_type() == DT_INT32) {
        if (!TransformAttributeBackToSignedType<int32_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT16) {
        if (!TransformAttributeBackToSignedType<int16_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT8) {
        if (!TransformAttributeBackToSignedType<int8_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      }
      num_processed_signed_components += att->num_components();
    } else if (att->data_type() == DT_FLOAT32) {
      // TODO(ostava): This code should be probably moved out to attribute
      // transform and shared with the SequentialQuantizationAttributeDecoder.

      const PointAttribute *const src_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();

      const AttributeQuantizationTransform &transform =
          attribute_quantization_transforms_
              [num_processed_quantized_attributes];

      num_processed_quantized_attributes++;

      if (GetDecoder()->options()->GetAttributeBool(
              att->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        att->CopyFrom(*src_att);
        continue;
      }

      // Convert all quantized values back to floats.
      const int32_t max_quantized_value =
          (1u << static_cast<uint32_t>(transform.quantization_bits())) - 1;
      const int num_components = att->num_components();
      const int entry_size = sizeof(float) * num_components;
      const std::unique_ptr<float[]> att_val(new float[num_components]);
      int quant_val_id = 0;
      int out_byte_pos = 0;
      Dequantizer dequantizer;
      if (!dequantizer.Init(transform.range(), max_quantized_value)) {
        return false;
      }
      const uint32_t *const portable_attribute_data =
          reinterpret_cast<const uint32_t *>(
              src_att->GetAddress(AttributeValueIndex(0)));
      for (uint32_t i = 0; i < src_att->size(); ++i) {
        for (int c = 0; c < num_components; ++c) {
          float value = dequantizer.DequantizeFloat(
              portable_attribute_data[quant_val_id++]);
          value = value + transform.min_value(c);
          att_val[c] = value;
        }
        // Store the floating point value into the attribute buffer.
        att->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
        out_byte_pos += entry_size;
      }
    }
  }
  return true;
}